

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::declare_temporary_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t result_type,uint32_t result_id
          )

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar1;
  size_t sVar2;
  SPIRType *type;
  size_type sVar3;
  Bitset *flags;
  SPIRBlock *pSVar4;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar5;
  char (*pacVar6) [4];
  long lVar7;
  long lVar8;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar9;
  uint32_t result_id_local;
  uint32_t result_type_local;
  string local_88;
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  result_id_local = result_id;
  result_type_local = result_type;
  type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  if ((this->block_temporary_hoisting == false) &&
     (this->current_continue_block != (SPIRBlock *)0x0)) {
    this_00 = &(this->super_Compiler).hoisted_temporaries;
    sVar3 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this_00->_M_h,&result_id_local);
    if (sVar3 == 0) {
      pSVar4 = Compiler::get<spirv_cross::SPIRBlock>
                         (&this->super_Compiler,(this->current_continue_block->loop_dominator).id);
      ppVar1 = (pSVar4->declare_temporary).
               super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
               .ptr;
      sVar2 = (pSVar4->declare_temporary).
              super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
              .buffer_size;
      ppVar5 = ppVar1 + 2;
      lVar7 = sVar2 << 3;
      for (lVar8 = (long)sVar2 >> 2; 0 < lVar8; lVar8 = lVar8 + -1) {
        if ((ppVar5[-2].first.id == result_type) && (ppVar5[-2].second.id == result_id_local)) {
          ppVar9 = ppVar5 + -2;
          goto LAB_00256921;
        }
        if ((ppVar5[-1].first.id == result_type) && (ppVar5[-1].second.id == result_id_local)) {
          ppVar9 = ppVar5 + -1;
          goto LAB_00256921;
        }
        if (((ppVar5->first).id == result_type) &&
           (ppVar9 = ppVar5, (ppVar5->second).id == result_id_local)) goto LAB_00256921;
        if ((ppVar5[1].first.id == result_type) && (ppVar5[1].second.id == result_id_local)) {
          ppVar9 = ppVar5 + 1;
          goto LAB_00256921;
        }
        ppVar5 = ppVar5 + 4;
        lVar7 = lVar7 + -0x20;
      }
      lVar7 = lVar7 >> 3;
      ppVar9 = ppVar5 + -2;
      if (lVar7 == 1) {
LAB_002569b3:
        if (((ppVar9->first).id == result_type) && ((ppVar9->second).id == result_id_local))
        goto LAB_00256921;
LAB_00256926:
        SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
        ::emplace_back<unsigned_int&,unsigned_int&>
                  ((SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
                    *)&pSVar4->declare_temporary,&result_type_local,&result_id_local);
        ::std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)this_00,&result_id_local);
        Compiler::force_recompile_guarantee_forward_progress(&this->super_Compiler);
      }
      else {
        if (lVar7 == 3) {
          if ((ppVar5[-2].first.id != result_type) || (ppVar5[-2].second.id != result_id_local)) {
            ppVar9 = ppVar5 + -1;
            goto LAB_002569a0;
          }
        }
        else {
          if (lVar7 != 2) goto LAB_00256926;
LAB_002569a0:
          if (((ppVar9->first).id != result_type) || ((ppVar9->second).id != result_id_local)) {
            ppVar9 = ppVar9 + 1;
            goto LAB_002569b3;
          }
        }
LAB_00256921:
        if (ppVar9 == ppVar1 + sVar2) goto LAB_00256926;
      }
      pacVar6 = (char (*) [4])0x1;
      (*(this->super_Compiler)._vptr_Compiler[6])(&local_88,this,(ulong)result_id_local);
      join<std::__cxx11::string,char_const(&)[4]>
                (__return_storage_ptr__,(spirv_cross *)&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x395f16,
                 pacVar6);
      goto LAB_00256975;
    }
  }
  sVar3 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->super_Compiler).hoisted_temporaries._M_h,&result_id_local);
  if (sVar3 == 0) {
    add_local_variable_name(this,result_id_local);
    flags = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)result_id_local);
    flags_to_qualifiers_glsl_abi_cxx11_(&local_88,this,type,flags);
    (*(this->super_Compiler)._vptr_Compiler[6])(local_68,this,(ulong)result_id_local,1);
    pacVar6 = (char (*) [4])0x0;
    (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_48,this,type,local_68);
    join<std::__cxx11::string,std::__cxx11::string,char_const(&)[4]>
              (__return_storage_ptr__,(spirv_cross *)&local_88,&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x395f16,pacVar6
              );
    ::std::__cxx11::string::~string((string *)&local_48);
    ::std::__cxx11::string::~string(local_68);
  }
  else {
    pacVar6 = (char (*) [4])0x1;
    (*(this->super_Compiler)._vptr_Compiler[6])(&local_88,this,(ulong)result_id_local);
    join<std::__cxx11::string,char_const(&)[4]>
              (__return_storage_ptr__,(spirv_cross *)&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x395f16,pacVar6
              );
  }
LAB_00256975:
  ::std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::declare_temporary(uint32_t result_type, uint32_t result_id)
{
	auto &type = get<SPIRType>(result_type);

	// If we're declaring temporaries inside continue blocks,
	// we must declare the temporary in the loop header so that the continue block can avoid declaring new variables.
	if (!block_temporary_hoisting && current_continue_block && !hoisted_temporaries.count(result_id))
	{
		auto &header = get<SPIRBlock>(current_continue_block->loop_dominator);
		if (find_if(begin(header.declare_temporary), end(header.declare_temporary),
		            [result_type, result_id](const pair<uint32_t, uint32_t> &tmp) {
			            return tmp.first == result_type && tmp.second == result_id;
		            }) == end(header.declare_temporary))
		{
			header.declare_temporary.emplace_back(result_type, result_id);
			hoisted_temporaries.insert(result_id);
			force_recompile_guarantee_forward_progress();
		}

		return join(to_name(result_id), " = ");
	}
	else if (hoisted_temporaries.count(result_id))
	{
		// The temporary has already been declared earlier, so just "declare" the temporary by writing to it.
		return join(to_name(result_id), " = ");
	}
	else
	{
		// The result_id has not been made into an expression yet, so use flags interface.
		add_local_variable_name(result_id);
		auto &flags = get_decoration_bitset(result_id);
		return join(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(result_id)), " = ");
	}
}